

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

void __thiscall crnlib::dxt_image::flip_row(dxt_image *this,uint y)

{
  uint uVar1;
  element_type eVar2;
  long lVar3;
  dxt1_block *this_00;
  int iVar4;
  uint x;
  uint uVar5;
  uint e;
  int iVar6;
  ulong uVar7;
  element tmp [2];
  
  iVar4 = ~y + this->m_blocks_y;
  for (uVar5 = 0; uVar5 < this->m_blocks_x; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar1 = this->m_num_elements_per_block, uVar7 < uVar1; uVar7 = uVar7 + 1) {
      iVar6 = (int)uVar7;
      tmp[0].m_bytes = *&this->m_pElements[(this->m_blocks_x * y + uVar5) * uVar1 + iVar6].m_bytes;
      tmp[1].m_bytes =
           *&this->m_pElements[(this->m_blocks_x * iVar4 + uVar5) * uVar1 + iVar6].m_bytes;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
        eVar2 = this->m_element_type[uVar7];
        this_00 = (dxt1_block *)(tmp[0].m_bytes + lVar3);
        if (eVar2 == cAlphaDXT5) {
          dxt5_block::flip_y((dxt5_block *)this_00,4,4);
        }
        else if (eVar2 == cAlphaDXT3) {
          dxt3_block::flip_y((dxt3_block *)this_00,4,4);
        }
        else if (eVar2 == cColorDXT1) {
          dxt1_block::flip_y(this_00,4,4);
        }
      }
      *&this->m_pElements[(this->m_blocks_x * y + uVar5) * this->m_num_elements_per_block + iVar6].
        m_bytes = tmp[1].m_bytes;
      *&this->m_pElements
        [(this->m_blocks_x * iVar4 + uVar5) * this->m_num_elements_per_block + iVar6].m_bytes =
           tmp[0].m_bytes;
    }
  }
  return;
}

Assistant:

void dxt_image::flip_row(uint y) {
  const uint other_y = (m_blocks_y - 1) - y;
  for (uint x = 0; x < m_blocks_x; x++) {
    for (uint e = 0; e < get_elements_per_block(); e++) {
      element tmp[2] = {get_element(x, y, e), get_element(x, other_y, e)};

      for (uint i = 0; i < 2; i++) {
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp[i])->flip_y();
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp[i])->flip_y();
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp[i])->flip_y();
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
      }

      get_element(x, y, e) = tmp[1];
      get_element(x, other_y, e) = tmp[0];
    }
  }
}